

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall section_data::unique_sort_intercepts(section_data *this)

{
  bool bVar1;
  reference __in;
  type *__k;
  type *__x;
  type_conflict1 *ptVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>,_bool>
  pVar3;
  type_conflict1 *ins;
  type *it;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>,_bool>
  local_d0;
  intercept_data *local_c0;
  __normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
  local_b8;
  const_iterator local_b0;
  intercept_data *local_a8;
  __normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
  local_a0;
  __normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
  local_98;
  const_iterator local_90;
  intercept_data *local_88;
  __normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
  local_80;
  undefined1 local_64 [8];
  intercept_data boxing_boundary;
  vector<intercept_data,_std::allocator<intercept_data>_> vec;
  type *val;
  type *key;
  _Self local_28;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<intercept_data,_std::allocator<intercept_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
  *__range1;
  section_data *this_local;
  
  __end1 = std::
           map<int,_std::vector<intercept_data,_std::allocator<intercept_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
           ::begin(&this->layer_intercepts);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<intercept_data,_std::allocator<intercept_data>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>_>
       ::end(&this->layer_intercepts);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_28);
    if (!bVar1) {
      return 0;
    }
    __in = std::
           _Rb_tree_iterator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>
           ::operator*(&__end1);
    __k = std::get<0ul,int_const,std::vector<intercept_data,std::allocator<intercept_data>>>(__in);
    __x = std::get<1ul,int_const,std::vector<intercept_data,std::allocator<intercept_data>>>(__in);
    std::vector<intercept_data,_std::allocator<intercept_data>_>::vector
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y,__x);
    local_64._0_4_ = this->x1;
    local_64._4_4_ = this->y1;
    boxing_boundary.x = 0;
    std::vector<intercept_data,_std::allocator<intercept_data>_>::push_back
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y,
               (value_type *)local_64);
    local_64._0_4_ = this->x2;
    local_64._4_4_ = this->y2;
    boxing_boundary.x = this->xsec_distance;
    std::vector<intercept_data,_std::allocator<intercept_data>_>::push_back
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y,
               (value_type *)local_64);
    local_80._M_current =
         (intercept_data *)
         std::vector<intercept_data,_std::allocator<intercept_data>_>::begin
                   ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y);
    local_88 = (intercept_data *)
               std::vector<intercept_data,_std::allocator<intercept_data>_>::end
                         ((vector<intercept_data,_std::allocator<intercept_data>_> *)
                          &boxing_boundary.y);
    std::
    sort<__gnu_cxx::__normal_iterator<intercept_data*,std::vector<intercept_data,std::allocator<intercept_data>>>>
              (local_80,(__normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
                         )local_88);
    local_a0._M_current =
         (intercept_data *)
         std::vector<intercept_data,_std::allocator<intercept_data>_>::begin
                   ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y);
    local_a8 = (intercept_data *)
               std::vector<intercept_data,_std::allocator<intercept_data>_>::end
                         ((vector<intercept_data,_std::allocator<intercept_data>_> *)
                          &boxing_boundary.y);
    local_98 = std::
               unique<__gnu_cxx::__normal_iterator<intercept_data*,std::vector<intercept_data,std::allocator<intercept_data>>>>
                         (local_a0,(__normal_iterator<intercept_data_*,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>
                                    )local_a8);
    __gnu_cxx::
    __normal_iterator<intercept_data_const*,std::vector<intercept_data,std::allocator<intercept_data>>>
    ::__normal_iterator<intercept_data*>
              ((__normal_iterator<intercept_data_const*,std::vector<intercept_data,std::allocator<intercept_data>>>
                *)&local_90,&local_98);
    local_b8._M_current =
         (intercept_data *)
         std::vector<intercept_data,_std::allocator<intercept_data>_>::end
                   ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y);
    __gnu_cxx::
    __normal_iterator<intercept_data_const*,std::vector<intercept_data,std::allocator<intercept_data>>>
    ::__normal_iterator<intercept_data*>
              ((__normal_iterator<intercept_data_const*,std::vector<intercept_data,std::allocator<intercept_data>>>
                *)&local_b0,&local_b8);
    local_c0 = (intercept_data *)
               std::vector<intercept_data,_std::allocator<intercept_data>_>::erase
                         ((vector<intercept_data,_std::allocator<intercept_data>_> *)
                          &boxing_boundary.y,local_90,local_b0);
    pVar3 = std::
            map<int,std::vector<intercept_data,std::allocator<intercept_data>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>>
            ::insert_or_assign<std::vector<intercept_data,std::allocator<intercept_data>>&>
                      ((map<int,std::vector<intercept_data,std::allocator<intercept_data>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>>
                        *)&this->layer_intercepts,__k,
                       (vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y
                      );
    local_d0.first = pVar3.first._M_node;
    local_d0.second = pVar3.second;
    std::
    get<0ul,std::_Rb_tree_iterator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>,bool>
              (&local_d0);
    ptVar2 = std::
             get<1ul,std::_Rb_tree_iterator<std::pair<int_const,std::vector<intercept_data,std::allocator<intercept_data>>>>,bool>
                       (&local_d0);
    if ((*ptVar2 & 1U) != 0) break;
    std::vector<intercept_data,_std::allocator<intercept_data>_>::~vector
              ((vector<intercept_data,_std::allocator<intercept_data>_> *)&boxing_boundary.y);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<intercept_data,_std::allocator<intercept_data>_>_>_>
    ::operator++(&__end1);
  }
  __assert_fail("ins == false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HeinrichHerbst[P]Katana/katana_backend/src/section.cpp"
                ,0x353,"int section_data::unique_sort_intercepts()");
}

Assistant:

int section_data::unique_sort_intercepts()
{
  for (auto const &[key, val] : layer_intercepts)
  {
    auto vec = val;
    // add beginning and end points [boundary zone]
    intercept_data boxing_boundary;
    boxing_boundary.x = x1;
    boxing_boundary.y = y1;
    boxing_boundary.dist = 0;
    vec.push_back(boxing_boundary);
    boxing_boundary.x = x2;
    boxing_boundary.y = y2;
    boxing_boundary.dist = xsec_distance;
    vec.push_back(boxing_boundary);
    sort(vec.begin(), vec.end()); // must sort first
    vec.erase(unique(vec.begin(), vec.end()), vec.end());
    auto [it, ins] = layer_intercepts.insert_or_assign(key, vec);
    assert(ins == false);
  }
  return EXIT_SUCCESS;
}